

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isRLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  pointer pSVar1;
  bool bVar2;
  Sym *s;
  Sym *pSVar3;
  bool bVar4;
  
  s = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pSVar3 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = true;
  if (s != pSVar3) {
    pSVar3 = pSVar3 + -1;
    bVar4 = s == pSVar3;
    if ((!bVar4) && (bVar2 = isTerminal(this,s,scc), bVar2)) {
      do {
        s = s + 1;
        bVar4 = s == pSVar3;
        if (bVar4) break;
        bVar2 = isTerminal(this,s,scc);
      } while (bVar2);
    }
    if (bVar4) {
      pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = true;
      if (pSVar1[-1].x != lhs * 2 + 1) {
        bVar4 = isTerminal(this,pSVar1 + -1,scc);
        return bVar4;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool isRLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
      
    if (allTerminal(rhs.begin(), rhs.end()-1, scc))
    {
      return ((rhs[rhs.size()-1] == EdgeSym::mkVar(lhs)) || 
              isTerminal(rhs[rhs.size()-1],scc));
    }
    else
      return false;
  }